

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample_48khz.c
# Opt level: O0

void WebRtcSpl_Resample48khzTo16khz
               (int16_t *in,int16_t *out,WebRtcSpl_State48khzTo16khz *state,int32_t *tmpmem)

{
  int32_t *tmpmem_local;
  WebRtcSpl_State48khzTo16khz *state_local;
  int16_t *out_local;
  int16_t *in_local;
  
  WebRtcSpl_LPBy2ShortToInt(in,0x1e0,tmpmem + 0x10,state->S_48_48);
  *(undefined8 *)(tmpmem + 8) = *(undefined8 *)state->S_48_32;
  *(undefined8 *)(tmpmem + 10) = *(undefined8 *)(state->S_48_32 + 2);
  *(undefined8 *)(tmpmem + 0xc) = *(undefined8 *)(state->S_48_32 + 4);
  *(undefined8 *)(tmpmem + 0xe) = *(undefined8 *)(state->S_48_32 + 6);
  *(undefined8 *)state->S_48_32 = *(undefined8 *)(tmpmem + 0x1e8);
  *(undefined8 *)(state->S_48_32 + 2) = *(undefined8 *)(tmpmem + 0x1ea);
  *(undefined8 *)(state->S_48_32 + 4) = *(undefined8 *)(tmpmem + 0x1ec);
  *(undefined8 *)(state->S_48_32 + 6) = *(undefined8 *)(tmpmem + 0x1ee);
  WebRtcSpl_Resample48khzTo32khz(tmpmem + 8,tmpmem,0xa0);
  WebRtcSpl_DownBy2IntToShort(tmpmem,0x140,out,state->S_32_16);
  return;
}

Assistant:

void WebRtcSpl_Resample48khzTo16khz(const int16_t* in, int16_t* out,
                                    WebRtcSpl_State48khzTo16khz* state, int32_t* tmpmem)
{
    ///// 48 --> 48(LP) /////
    // int16_t  in[480]
    // int32_t out[480]
    /////
    WebRtcSpl_LPBy2ShortToInt(in, 480, tmpmem + 16, state->S_48_48);

    ///// 48 --> 32 /////
    // int32_t  in[480]
    // int32_t out[320]
    /////
    // copy state to and from input array
    memcpy(tmpmem + 8, state->S_48_32, 8 * sizeof(int32_t));
    memcpy(state->S_48_32, tmpmem + 488, 8 * sizeof(int32_t));
    WebRtcSpl_Resample48khzTo32khz(tmpmem + 8, tmpmem, 160);

    ///// 32 --> 16 /////
    // int32_t  in[320]
    // int16_t out[160]
    /////
    WebRtcSpl_DownBy2IntToShort(tmpmem, 320, out, state->S_32_16);
}